

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool perfetto::internal::TrackEventInternal::IsCategoryEnabled
               (TrackEventCategoryRegistry *registry,TrackEventConfig *config,Category *category)

{
  byte bVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  long lVar4;
  uint uVar5;
  ulong __n;
  char *__s2;
  size_t sVar6;
  Category *category_00;
  bool bVar7;
  value_type match_type;
  array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> match_types;
  anon_class_8_1_eaeee27c has_matching_tag;
  allocator<char> local_fd;
  MatchType local_fc;
  TrackEventCategoryRegistry *local_f8;
  TrackEventConfig *local_f0;
  Category *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  MatchType local_d0 [2];
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  anon_class_8_1_eaeee27c local_88 [4];
  Category local_68;
  
  local_f0 = config;
  local_e8 = category;
  if ((category->name_sizes_)._M_elems[1] == '\0') {
    local_d0[0] = kExact;
    local_d0[1] = kPattern;
    local_d8 = &config->enabled_categories_;
    pvVar3 = &config->disabled_categories_;
    lVar4 = 0;
    local_f8 = registry;
    local_e0 = pvVar3;
    local_88[0].category = category;
    do {
      local_f8 = (TrackEventCategoryRegistry *)
                 CONCAT44(local_f8._4_4_,(int)CONCAT71((int7)((ulong)pvVar3 >> 8),lVar4 == 8));
      if (lVar4 == 8) break;
      local_fc = *(MatchType *)((long)local_d0 + lVar4);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,category->name,&local_fd);
      bVar7 = anon_unknown_17::NameMatchesPatternList(local_d8,(string *)&local_68,local_fc);
      ::std::__cxx11::string::~string((string *)&local_68);
      uVar5 = 1;
      if (bVar7) {
LAB_002f1b81:
        local_f8 = (TrackEventCategoryRegistry *)(ulong)uVar5;
        break;
      }
      local_a8._M_unused._M_object = local_f0;
      local_a8._8_8_ = &local_fc;
      local_90 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45319:26)>
                 ::_M_invoke;
      local_98 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45319:26)>
                 ::_M_manager;
      bVar7 = IsCategoryEnabled::anon_class_8_1_eaeee27c::operator()
                        (local_88,(function<bool_(const_char_*)> *)&local_a8);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_a8);
      category = local_e8;
      if (bVar7) goto LAB_002f1b81;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,local_e8->name,&local_fd);
      bVar7 = anon_unknown_17::NameMatchesPatternList(local_e0,(string *)&local_68,local_fc);
      ::std::__cxx11::string::~string((string *)&local_68);
      if (bVar7) {
        uVar5 = 0;
        goto LAB_002f1b81;
      }
      local_c8._M_unused._M_object = local_f0;
      local_c8._8_8_ = &local_fc;
      local_b0 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45332:26)>
                 ::_M_invoke;
      local_b8 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45332:26)>
                 ::_M_manager;
      bVar7 = IsCategoryEnabled::anon_class_8_1_eaeee27c::operator()
                        (local_88,(function<bool_(const_char_*)> *)&local_c8);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
      lVar4 = lVar4 + 4;
      pvVar3 = extraout_RAX;
    } while (!bVar7);
  }
  else {
    __s2 = category->name;
    lVar4 = 0;
    local_f8 = registry;
    while (lVar4 != 4) {
      bVar1 = (local_e8->name_sizes_)._M_elems[lVar4];
      __n = (ulong)bVar1;
      if (__n == 0) break;
      lVar4 = lVar4 + 1;
      category_00 = local_f8->categories_;
      sVar6 = local_f8->category_count_;
      while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
        if ((((category_00->name_sizes_)._M_elems[1] == '\0') &&
            ((category_00->name_sizes_)._M_elems[0] == bVar1)) &&
           (iVar2 = strncmp(category_00->name,__s2,__n), iVar2 == 0)) {
          bVar7 = IsCategoryEnabled(local_f8,local_f0,category_00);
          if (bVar7) {
            return true;
          }
          break;
        }
        category_00 = category_00 + 1;
      }
      local_68.name = (char *)&local_68.tags;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s2,__s2 + __n);
      ::std::__cxx11::string::string((string *)local_88,(string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      Category::FromDynamicCategory(&local_68,(char *)local_88[0].category);
      bVar7 = IsCategoryEnabled(local_f8,local_f0,&local_68);
      ::std::__cxx11::string::~string((string *)local_88);
      if (bVar7) {
        return true;
      }
      __s2 = __s2 + __n + 1;
    }
    local_f8._0_1_ = 0;
  }
  return (bool)local_f8._0_1_;
}

Assistant:

bool TrackEventInternal::IsCategoryEnabled(
    const TrackEventCategoryRegistry& registry,
    const protos::gen::TrackEventConfig& config,
    const Category& category) {
  // If this is a group category, check if any of its constituent categories are
  // enabled. If so, then this one is enabled too.
  if (category.IsGroup()) {
    bool result = false;
    category.ForEachGroupMember([&](const char* member_name, size_t name_size) {
      for (size_t i = 0; i < registry.category_count(); i++) {
        const auto ref_category = registry.GetCategory(i);
        // Groups can't refer to other groups.
        if (ref_category->IsGroup())
          continue;
        // Require an exact match.
        if (ref_category->name_size() != name_size ||
            strncmp(ref_category->name, member_name, name_size)) {
          continue;
        }
        if (IsCategoryEnabled(registry, config, *ref_category)) {
          result = true;
          // Break ForEachGroupMember() loop.
          return false;
        }
        break;
      }
      // No match? Must be a dynamic category.
      DynamicCategory dyn_category(std::string(member_name, name_size));
      Category ref_category{Category::FromDynamicCategory(dyn_category)};
      if (IsCategoryEnabled(registry, config, ref_category)) {
        result = true;
        // Break ForEachGroupMember() loop.
        return false;
      }
      // No match found => keep iterating.
      return true;
    });
    return result;
  }

  auto has_matching_tag = [&](std::function<bool(const char*)> matcher) {
    for (const auto& tag : category.tags) {
      if (!tag)
        break;
      if (matcher(tag))
        return true;
    }
    // Legacy "disabled-by-default" categories automatically get the "slow" tag.
    if (!strncmp(category.name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)) &&
        matcher(kSlowTag)) {
      return true;
    }
    return false;
  };

  // First try exact matches, then pattern matches.
  const std::array<MatchType, 2> match_types = {
      {MatchType::kExact, MatchType::kPattern}};
  for (auto match_type : match_types) {
    // 1. Enabled categories.
    if (NameMatchesPatternList(config.enabled_categories(), category.name,
                               match_type)) {
      return true;
    }

    // 2. Enabled tags.
    if (has_matching_tag([&](const char* tag) {
          return NameMatchesPatternList(config.enabled_tags(), tag, match_type);
        })) {
      return true;
    }

    // 3. Disabled categories.
    if (NameMatchesPatternList(config.disabled_categories(), category.name,
                               match_type)) {
      return false;
    }

    // 4. Disabled tags.
    if (has_matching_tag([&](const char* tag) {
          if (config.disabled_tags_size()) {
            return NameMatchesPatternList(config.disabled_tags(), tag,
                                          match_type);
          } else {
            // The "slow" and "debug" tags are disabled by default.
            return NameMatchesPattern(kSlowTag, tag, match_type) ||
                   NameMatchesPattern(kDebugTag, tag, match_type);
          }
        })) {
      return false;
    }
  }

  // If nothing matched, enable the category by default.
  return true;
}